

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O1

void gen_person(person_t *p)

{
  int iVar1;
  int iVar2;
  int i_2;
  ulong uVar3;
  long lVar4;
  int i;
  ulong uVar5;
  
  iVar1 = rand();
  iVar2 = 0xe;
  if (0xe < iVar1 % 0x400) {
    iVar2 = iVar1 % 0x400;
  }
  uVar3 = (ulong)(iVar2 - 1);
  iVar2 = rand();
  p->age = iVar2 % 100;
  uVar5 = 0;
  do {
    iVar2 = rand();
    p->key[uVar5] =
         "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[(ulong)(long)iVar2 % 0x3e]
    ;
    uVar5 = uVar5 + 1;
  } while (uVar3 != uVar5);
  p->key[uVar3 - 1] = '\0';
  uVar5 = 0;
  do {
    iVar2 = rand();
    p->name[uVar5] =
         "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[(ulong)(long)iVar2 % 0x3e]
    ;
    uVar5 = uVar5 + 1;
  } while (uVar3 != uVar5);
  p->name[uVar3 - 1] = '\0';
  lVar4 = -0xc;
  do {
    iVar2 = rand();
    p->city[lVar4 + 0xc] =
         "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[(ulong)(long)iVar2 % 0x3e]
    ;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0);
  p->city[0xb] = '\0';
  lVar4 = 0;
  do {
    iVar2 = rand();
    p->state[lVar4] =
         "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[(ulong)(long)iVar2 % 0x3e]
    ;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 2);
  p->state[1] = '\0';
  lVar4 = 0;
  do {
    iVar2 = rand();
    p->desc[lVar4] =
         "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[(ulong)(long)iVar2 % 0x3e]
    ;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x200);
  p->desc[0x1ff] = '\0';
  return;
}

Assistant:

void gen_person(person_t *p){

    int klen = rand() % MAXKEY_LEN - 1;
    if(klen<=MAXITR_LEN){
        klen=MAXITR_LEN+1;
    }
    p->age = rand() % 100;
    gen_random(p->key, klen);
    gen_random(p->name, klen);
    gen_random(p->city, 12);
    gen_random(p->state, 2);
    gen_random(p->desc, 512);

}